

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_prg.c
# Opt level: O2

void bashPrgCommit(octet code,void *state)

{
  byte *pbVar1;
  
  pbVar1 = (byte *)((long)state + *(long *)((long)state + 0xd8) + 0x10);
  *pbVar1 = *pbVar1 ^ code;
  pbVar1 = (byte *)((long)state + *(long *)((long)state + 0xd0) + 0x10);
  *pbVar1 = *pbVar1 ^ 0x80;
  bashF((octet *)((long)state + 0x10),(void *)((long)state + 0x1a0));
  *(undefined8 *)((long)state + 0xd8) = 0;
  return;
}

Assistant:

static void bashPrgCommit(octet code, void* state)
{
	bash_prg_st* st = (bash_prg_st*)state;
	ASSERT(memIsValid(st, bashPrg_keep()));
	ASSERT(st->pos < st->buf_len);
	// учесть code
	st->s[st->pos] ^= code;
	// инвертировать контрольный бит
	st->s[st->buf_len] ^= 0x80;
	// применить sponge-функцию
	bashF(st->s, st->stack);
	// сбросить pos
	st->pos = 0;
}